

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O0

void ClassifyHelper(int a_index,int a_group,ON_RTreePartitionVars *a_parVars)

{
  double dVar1;
  ON_RTreeBBox local_48;
  ON_RTreePartitionVars *local_18;
  ON_RTreePartitionVars *a_parVars_local;
  int a_group_local;
  int a_index_local;
  
  a_parVars->m_partition[a_index] = a_group;
  a_parVars->m_taken[a_index] = 1;
  local_18 = a_parVars;
  a_parVars_local._0_4_ = a_group;
  a_parVars_local._4_4_ = a_index;
  if (a_parVars->m_count[a_group] == 0) {
    memcpy(a_parVars->m_cover + a_group,a_parVars->m_branchBuf + a_index,0x30);
  }
  else {
    CombineRectHelper(&local_48,&a_parVars->m_branchBuf[a_index].m_rect,a_parVars->m_cover + a_group
                     );
    memcpy(local_18->m_cover + (int)a_parVars_local,&local_48,0x30);
  }
  dVar1 = CalcRectVolumeHelper(local_18->m_cover + (int)a_parVars_local);
  local_18->m_area[(int)a_parVars_local] = dVar1;
  local_18->m_count[(int)a_parVars_local] = local_18->m_count[(int)a_parVars_local] + 1;
  return;
}

Assistant:

void ClassifyHelper(int a_index, int a_group, ON_RTreePartitionVars* a_parVars)
{
  a_parVars->m_partition[a_index] = a_group;
  a_parVars->m_taken[a_index] = true;

  if (a_parVars->m_count[a_group] == 0)
  {
    a_parVars->m_cover[a_group] = a_parVars->m_branchBuf[a_index].m_rect;
  }
  else
  {
    a_parVars->m_cover[a_group] = CombineRectHelper(&a_parVars->m_branchBuf[a_index].m_rect, &a_parVars->m_cover[a_group]);
  }
  a_parVars->m_area[a_group] = CalcRectVolumeHelper(&a_parVars->m_cover[a_group]);
  ++a_parVars->m_count[a_group];
}